

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

Symbol __thiscall
google::protobuf::DescriptorBuilder::FindSymbolNotEnforcingDepsHelper
          (DescriptorBuilder *this,DescriptorPool *pool,string *name)

{
  Tables *pTVar1;
  _Node **pp_Var2;
  ulong uVar3;
  char *pcVar4;
  string *name_00;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  _Node *p_Var8;
  char cVar9;
  char *pcVar10;
  Symbol *pSVar11;
  _Node *p_Var13;
  Type TVar14;
  Symbol SVar15;
  MutexLockMaybe lock;
  MutexLockMaybe local_40;
  string *local_38;
  anon_union_8_7_bfa3a334_for_Symbol_2 aVar12;
  
  if (this->pool_ == pool) {
    local_40.mu_ = (Mutex *)0x0;
  }
  else {
    local_40.mu_ = pool->mutex_;
    if (local_40.mu_ != (Mutex *)0x0) {
      internal::Mutex::Lock(local_40.mu_);
    }
  }
  pTVar1 = (pool->tables_).ptr_;
  if (pTVar1 != (Tables *)0x0) {
    pp_Var2 = (pTVar1->symbols_by_name_).
              super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
              .
              super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
              .
              super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
              ._M_buckets;
    uVar3 = (pTVar1->symbols_by_name_).
            super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
            .
            super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
            .
            super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
            ._M_bucket_count;
    pcVar4 = (name->_M_dataplus)._M_p;
    cVar9 = *pcVar4;
    if (cVar9 == '\0') {
      uVar7 = 0;
    }
    else {
      uVar7 = 0;
      pcVar10 = pcVar4;
      do {
        pcVar10 = pcVar10 + 1;
        uVar7 = (long)cVar9 + uVar7 * 5;
        cVar9 = *pcVar10;
      } while (cVar9 != '\0');
    }
    local_38 = name;
    for (p_Var13 = pp_Var2[uVar7 % uVar3]; p_Var13 != (_Node *)0x0; p_Var13 = p_Var13->_M_next) {
      iVar6 = strcmp(pcVar4,(p_Var13->_M_v).first);
      if (iVar6 == 0) {
        p_Var8 = pp_Var2[uVar3];
        goto LAB_001dd336;
      }
    }
    p_Var8 = pp_Var2[uVar3];
    p_Var13 = p_Var8;
LAB_001dd336:
    name_00 = local_38;
    pSVar11 = &(p_Var13->_M_v).second;
    if (p_Var13 == p_Var8) {
      pSVar11 = (Symbol *)&(anonymous_namespace)::kNullSymbol;
    }
    aVar12 = (anon_union_8_7_bfa3a334_for_Symbol_2)(pSVar11->field_1).descriptor;
    TVar14 = pSVar11->type;
    if (TVar14 == NULL_SYMBOL) {
      if (pool->underlay_ != (DescriptorPool *)0x0) {
        SVar15 = FindSymbolNotEnforcingDepsHelper(this,pool->underlay_,local_38);
        aVar12 = SVar15.field_1;
        TVar14 = SVar15.type;
        if (TVar14 != NULL_SYMBOL) goto LAB_001dd35c;
      }
      bVar5 = DescriptorPool::TryFindSymbolInFallbackDatabase(pool,name_00);
      TVar14 = NULL_SYMBOL;
      if (bVar5) {
        pTVar1 = (pool->tables_).ptr_;
        if (pTVar1 == (Tables *)0x0) goto LAB_001dd442;
        pp_Var2 = (pTVar1->symbols_by_name_).
                  super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
                  .
                  super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
                  .
                  super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                  ._M_buckets;
        uVar3 = (pTVar1->symbols_by_name_).
                super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
                .
                super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
                .
                super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                ._M_bucket_count;
        pcVar4 = (name_00->_M_dataplus)._M_p;
        cVar9 = *pcVar4;
        if (cVar9 == '\0') {
          uVar7 = 0;
        }
        else {
          uVar7 = 0;
          pcVar10 = pcVar4;
          do {
            pcVar10 = pcVar10 + 1;
            uVar7 = (long)cVar9 + uVar7 * 5;
            cVar9 = *pcVar10;
          } while (cVar9 != '\0');
        }
        for (p_Var13 = pp_Var2[uVar7 % uVar3]; p_Var13 != (_Node *)0x0; p_Var13 = p_Var13->_M_next)
        {
          iVar6 = strcmp(pcVar4,(p_Var13->_M_v).first);
          if (iVar6 == 0) {
            p_Var8 = pp_Var2[uVar3];
            goto LAB_001dd421;
          }
        }
        p_Var8 = pp_Var2[uVar3];
        p_Var13 = p_Var8;
LAB_001dd421:
        pSVar11 = &(p_Var13->_M_v).second;
        if (p_Var13 == p_Var8) {
          pSVar11 = (Symbol *)&(anonymous_namespace)::kNullSymbol;
        }
        aVar12 = (anon_union_8_7_bfa3a334_for_Symbol_2)(pSVar11->field_1).descriptor;
        TVar14 = pSVar11->type;
      }
    }
LAB_001dd35c:
    internal::MutexLockMaybe::~MutexLockMaybe(&local_40);
    SVar15._4_4_ = 0;
    SVar15.type = TVar14;
    SVar15.field_1.descriptor = aVar12.descriptor;
    return SVar15;
  }
LAB_001dd442:
  __assert_fail("ptr_ != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/stubs/common.h"
                ,0x1e2,
                "C *google::protobuf::internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->() const [C = google::protobuf::DescriptorPool::Tables]"
               );
}

Assistant:

Symbol DescriptorBuilder::FindSymbolNotEnforcingDepsHelper(
    const DescriptorPool* pool, const string& name) {
  // If we are looking at an underlay, we must lock its mutex_, since we are
  // accessing the underlay's tables_ directly.
  MutexLockMaybe lock((pool == pool_) ? NULL : pool->mutex_);

  Symbol result = pool->tables_->FindSymbol(name);
  if (result.IsNull() && pool->underlay_ != NULL) {
    // Symbol not found; check the underlay.
    result = FindSymbolNotEnforcingDepsHelper(pool->underlay_, name);
  }

  if (result.IsNull()) {
    // In theory, we shouldn't need to check fallback_database_ because the
    // symbol should be in one of its file's direct dependencies, and we have
    // already loaded those by the time we get here.  But we check anyway so
    // that we can generate better error message when dependencies are missing
    // (i.e., "missing dependency" rather than "type is not defined").
    if (pool->TryFindSymbolInFallbackDatabase(name)) {
      result = pool->tables_->FindSymbol(name);
    }
  }

  return result;
}